

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_RegExpExec(JSContext *ctx,JSValue r,JSValue s)

{
  int iVar1;
  uint uVar2;
  int argc;
  JSValue val;
  JSValue s_local;
  
  s_local.tag = s.tag;
  s_local.u = s.u;
  argc = 0x86;
  val = JS_GetPropertyInternal(ctx,r,0x86,r,0);
  if ((int)val.tag != 6) {
    iVar1 = JS_IsFunction(ctx,val);
    if (iVar1 == 0) {
      JS_FreeValue(ctx,val);
      val = js_regexp_exec(ctx,r,argc,&s_local);
    }
    else {
      val = JS_CallFree(ctx,val,r,1,&s_local);
      uVar2 = (int)val.tag + 1;
      if ((7 < uVar2) || ((0x89U >> (uVar2 & 0x1f) & 1) == 0)) {
        JS_FreeValue(ctx,val);
        JS_ThrowTypeError(ctx,"RegExp exec method must return an object or null");
        val = (JSValue)(ZEXT816(6) << 0x40);
      }
    }
  }
  return val;
}

Assistant:

static JSValue JS_RegExpExec(JSContext *ctx, JSValueConst r, JSValueConst s)
{
    JSValue method, ret;

    method = JS_GetProperty(ctx, r, JS_ATOM_exec);
    if (JS_IsException(method))
        return method;
    if (JS_IsFunction(ctx, method)) {
        ret = JS_CallFree(ctx, method, r, 1, &s);
        if (JS_IsException(ret))
            return ret;
        if (!JS_IsObject(ret) && !JS_IsNull(ret)) {
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "RegExp exec method must return an object or null");
        }
        return ret;
    }
    JS_FreeValue(ctx, method);
    return js_regexp_exec(ctx, r, 1, &s);
}